

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_qemu_st_direct
               (TCGContext_conflict9 *s,TCGReg datalo,TCGReg datahi,TCGReg base,int index,
               intptr_t ofs,int seg,MemOp memop)

{
  int local_38;
  MemOp local_34;
  int movop;
  MemOp bswap;
  MemOp real_bswap;
  TCGReg scratch;
  intptr_t ofs_local;
  int index_local;
  TCGReg base_local;
  TCGReg datahi_local;
  TCGReg datalo_local;
  TCGContext_conflict9 *s_local;
  
  local_34 = memop & MO_BE;
  local_38 = 0x89;
  if ((have_movbe) && (local_34 != MO_8)) {
    local_34 = MO_8;
    local_38 = 0x2f1;
  }
  base_local = datalo;
  switch(memop & MO_64) {
  case MO_8:
    tcg_out_modrm_sib_offset(s,seg + 0x2088,datalo,base,index,0,ofs);
    break;
  case MO_16:
    if (local_34 != MO_8) {
      tcg_out_mov(s,TCG_TYPE_I32,TCG_REG_EDI,datalo);
      tcg_out_rolw_8(s,7);
      base_local = TCG_REG_EDI;
    }
    tcg_out_modrm_sib_offset(s,local_38 + 0x400 + seg,base_local,base,index,0,ofs);
    break;
  case MO_32:
    if (local_34 != MO_8) {
      tcg_out_mov(s,TCG_TYPE_I32,TCG_REG_EDI,datalo);
      tcg_out_bswap32(s,7);
      base_local = TCG_REG_EDI;
    }
    tcg_out_modrm_sib_offset(s,local_38 + seg,base_local,base,index,0,ofs);
    break;
  case MO_64:
    if (local_34 != MO_8) {
      tcg_out_mov(s,TCG_TYPE_I64,TCG_REG_EDI,datalo);
      tcg_out_bswap64(s,7);
      base_local = TCG_REG_EDI;
    }
    tcg_out_modrm_sib_offset(s,local_38 + 0x1000 + seg,base_local,base,index,0,ofs);
    break;
  default:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ,0x888);
    abort();
  }
  return;
}

Assistant:

static void tcg_out_qemu_st_direct(TCGContext *s, TCGReg datalo, TCGReg datahi,
                                   TCGReg base, int index, intptr_t ofs,
                                   int seg, MemOp memop)
{
    /* ??? Ideally we wouldn't need a scratch register.  For user-only,
       we could perform the bswap twice to restore the original value
       instead of moving to the scratch.  But as it is, the L constraint
       means that TCG_REG_L0 is definitely free here.  */
    const TCGReg scratch = TCG_REG_L0;
    const MemOp real_bswap = memop & MO_BSWAP;
    MemOp bswap = real_bswap;
    int movop = OPC_MOVL_EvGv;

    if (have_movbe && real_bswap) {
        bswap = 0;
        movop = OPC_MOVBE_MyGy;
    }

    switch (memop & MO_SIZE) {
    case MO_8:
        /* In 32-bit mode, 8-bit stores can only happen from [abcd]x.
           Use the scratch register if necessary.  */
        if (TCG_TARGET_REG_BITS == 32 && datalo >= 4) {
            tcg_out_mov(s, TCG_TYPE_I32, scratch, datalo);
            datalo = scratch;
        }
        tcg_out_modrm_sib_offset(s, OPC_MOVB_EvGv + P_REXB_R + seg,
                                 datalo, base, index, 0, ofs);
        break;
    case MO_16:
        if (bswap) {
            tcg_out_mov(s, TCG_TYPE_I32, scratch, datalo);
            tcg_out_rolw_8(s, scratch);
            datalo = scratch;
        }
        tcg_out_modrm_sib_offset(s, movop + P_DATA16 + seg, datalo,
                                 base, index, 0, ofs);
        break;
    case MO_32:
        if (bswap) {
            tcg_out_mov(s, TCG_TYPE_I32, scratch, datalo);
            tcg_out_bswap32(s, scratch);
            datalo = scratch;
        }
        tcg_out_modrm_sib_offset(s, movop + seg, datalo, base, index, 0, ofs);
        break;
    case MO_64:
        if (TCG_TARGET_REG_BITS == 64) {
            if (bswap) {
                tcg_out_mov(s, TCG_TYPE_I64, scratch, datalo);
                tcg_out_bswap64(s, scratch);
                datalo = scratch;
            }
            tcg_out_modrm_sib_offset(s, movop + P_REXW + seg, datalo,
                                     base, index, 0, ofs);
        } else if (bswap) {
            tcg_out_mov(s, TCG_TYPE_I32, scratch, datahi);
            tcg_out_bswap32(s, scratch);
            tcg_out_modrm_sib_offset(s, OPC_MOVL_EvGv + seg, scratch,
                                     base, index, 0, ofs);
            tcg_out_mov(s, TCG_TYPE_I32, scratch, datalo);
            tcg_out_bswap32(s, scratch);
            tcg_out_modrm_sib_offset(s, OPC_MOVL_EvGv + seg, scratch,
                                     base, index, 0, ofs + 4);
        } else {
            if (real_bswap) {
                int t = datalo;
                datalo = datahi;
                datahi = t;
            }
            tcg_out_modrm_sib_offset(s, movop + seg, datalo,
                                     base, index, 0, ofs);
            tcg_out_modrm_sib_offset(s, movop + seg, datahi,
                                     base, index, 0, ofs + 4);
        }
        break;
    default:
        tcg_abort();
    }
}